

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall
duckdb_parquet::BloomFilterCompression::printTo(BloomFilterCompression *this,ostream *out)

{
  _BloomFilterCompression__isset _Var1;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"BloomFilterCompression(",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"UNCOMPRESSED=",0xd);
  _Var1 = this->__isset;
  if (((byte)_Var1 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::Uncompressed>(&local_40,&this->UNCOMPRESSED);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,local_40._M_dataplus._M_p,local_40._M_string_length);
  }
  if ((((byte)_Var1 & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2)) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,")",1);
  return;
}

Assistant:

void BloomFilterCompression::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "BloomFilterCompression(";
  out << "UNCOMPRESSED="; (__isset.UNCOMPRESSED ? (out << to_string(UNCOMPRESSED)) : (out << "<null>"));
  out << ")";
}